

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O1

FT_Error cff_get_advances(FT_Face face,FT_UInt start,FT_UInt count,FT_Int32 flags,FT_Fixed *advances
                         )

{
  FT_GlyphSlot_conflict cffslot;
  bool bVar1;
  FT_Error FVar2;
  FT_Error unaff_R13D;
  ulong uVar3;
  TT_Face ttface;
  undefined1 local_3a [2];
  ushort local_38;
  ushort local_36;
  FT_UInt FStack_34;
  FT_Short dummy;
  FT_UShort ah;
  FT_UShort aw;
  
  uVar3 = face->face_flags;
  cffslot = face->glyph;
  if ((uVar3 & 8) == 0) goto LAB_001fc815;
  if ((flags & 0x10U) == 0) {
    if (((uVar3 & 0x8000) == 0 && (face->face_index & 0x7fff0000U) == 0) ||
       (((ulong)face[4].charmap & 2) != 0)) {
      if (*(short *)((long)&face[1].memory + 6) == 0) {
LAB_001fc808:
        bVar1 = true;
        goto LAB_001fc811;
      }
      if (count != 0) {
        uVar3 = 0;
        FStack_34 = count;
        do {
          (**(code **)(*(long *)&face[3].units_per_EM + 0xe0))
                    (face,0,start + (int)uVar3,local_3a,&local_36);
          advances[uVar3] = (ulong)local_36;
          uVar3 = uVar3 + 1;
        } while (count != uVar3);
        goto LAB_001fc7fa;
      }
LAB_001fc80c:
      unaff_R13D = 0;
    }
    else {
LAB_001fc79a:
      unaff_R13D = 7;
    }
    bVar1 = false;
  }
  else {
    if (((uVar3 & 0x8000) != 0 || (face->face_index & 0x7fff0000U) != 0) &&
       (((ulong)face[4].charmap & 0x10) == 0)) goto LAB_001fc79a;
    if ((char)face[2].num_faces == '\0') goto LAB_001fc808;
    if (count == 0) goto LAB_001fc80c;
    uVar3 = 0;
    FStack_34 = count;
    do {
      (**(code **)(*(long *)&face[3].units_per_EM + 0xe0))
                (face,1,start + (int)uVar3,local_3a,&local_38);
      advances[uVar3] = (ulong)local_38;
      uVar3 = uVar3 + 1;
    } while (count != uVar3);
LAB_001fc7fa:
    unaff_R13D = 0;
    bVar1 = false;
    count = FStack_34;
  }
LAB_001fc811:
  if (!bVar1) {
    return unaff_R13D;
  }
LAB_001fc815:
  if (count != 0) {
    uVar3 = 0;
    do {
      FVar2 = cff_glyph_load(cffslot,face->size,start + (int)uVar3,flags | 0x100);
      if (FVar2 != 0) {
        return FVar2;
      }
      advances[uVar3] =
           *(FT_Fixed *)((long)&cffslot->library + ((ulong)((flags & 0x10U) >> 1) | 0x70));
      uVar3 = uVar3 + 1;
    } while (count != uVar3);
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  cff_get_advances( FT_Face    face,
                    FT_UInt    start,
                    FT_UInt    count,
                    FT_Int32   flags,
                    FT_Fixed*  advances )
  {
    FT_UInt       nn;
    FT_Error      error = FT_Err_Ok;
    FT_GlyphSlot  slot  = face->glyph;


    if ( FT_IS_SFNT( face ) )
    {
      /* OpenType 1.7 mandates that the data from `hmtx' table be used; */
      /* it is no longer necessary that those values are identical to   */
      /* the values in the `CFF' table                                  */

      TT_Face   ttface = (TT_Face)face;
      FT_Short  dummy;


      if ( flags & FT_LOAD_VERTICAL_LAYOUT )
      {
#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
        /* no fast retrieval for blended MM fonts without VVAR table */
        if ( ( FT_IS_NAMED_INSTANCE( face ) || FT_IS_VARIATION( face ) ) &&
             !( ttface->variation_support & TT_FACE_FLAG_VAR_VADVANCE )  )
          return FT_THROW( Unimplemented_Feature );
#endif

        /* check whether we have data from the `vmtx' table at all; */
        /* otherwise we extract the info from the CFF glyphstrings  */
        /* (instead of synthesizing a global value using the `OS/2' */
        /* table)                                                   */
        if ( !ttface->vertical_info )
          goto Missing_Table;

        for ( nn = 0; nn < count; nn++ )
        {
          FT_UShort  ah;


          ( (SFNT_Service)ttface->sfnt )->get_metrics( ttface,
                                                       1,
                                                       start + nn,
                                                       &dummy,
                                                       &ah );

          FT_TRACE5(( "  idx %d: advance height %d font unit%s\n",
                      start + nn,
                      ah,
                      ah == 1 ? "" : "s" ));
          advances[nn] = ah;
        }
      }
      else
      {
#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
        /* no fast retrieval for blended MM fonts without HVAR table */
        if ( ( FT_IS_NAMED_INSTANCE( face ) || FT_IS_VARIATION( face ) ) &&
             !( ttface->variation_support & TT_FACE_FLAG_VAR_HADVANCE )  )
          return FT_THROW( Unimplemented_Feature );
#endif

        /* check whether we have data from the `hmtx' table at all */
        if ( !ttface->horizontal.number_Of_HMetrics )
          goto Missing_Table;

        for ( nn = 0; nn < count; nn++ )
        {
          FT_UShort  aw;


          ( (SFNT_Service)ttface->sfnt )->get_metrics( ttface,
                                                       0,
                                                       start + nn,
                                                       &dummy,
                                                       &aw );

          FT_TRACE5(( "  idx %d: advance width %d font unit%s\n",
                      start + nn,
                      aw,
                      aw == 1 ? "" : "s" ));
          advances[nn] = aw;
        }
      }

      return error;
    }

  Missing_Table:
    flags |= (FT_UInt32)FT_LOAD_ADVANCE_ONLY;

    for ( nn = 0; nn < count; nn++ )
    {
      error = cff_glyph_load( slot, face->size, start + nn, flags );
      if ( error )
        break;

      advances[nn] = ( flags & FT_LOAD_VERTICAL_LAYOUT )
                     ? slot->linearVertAdvance
                     : slot->linearHoriAdvance;
    }

    return error;
  }